

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
dgrminer::find_forward_edge_candidates
          (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           *__return_storage_ptr__,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adj_list,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *adj_more_info,int src,vector<int,_std::allocator<int>_> *sequence_of_nodes,
          vector<int,_std::allocator<int>_> *real_second_edge_ids)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference this;
  reference __x;
  undefined8 local_58;
  size_t i;
  ulong uStack_48;
  bool is_in_sequence_of_nodes;
  size_t v;
  vector<int,_std::allocator<int>_> *real_second_edge_ids_local;
  vector<int,_std::allocator<int>_> *sequence_of_nodes_local;
  int src_local;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  *adj_more_info_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *adj_list_local;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *edge_candidates;
  
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (__return_storage_ptr__);
  uStack_48 = 0;
  do {
    pvVar3 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](adj_list,(long)src);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(pvVar3);
    if (sVar4 <= uStack_48) {
      return __return_storage_ptr__;
    }
    bVar2 = false;
    for (local_58 = 0; sVar4 = std::vector<int,_std::allocator<int>_>::size(sequence_of_nodes),
        local_58 < sVar4; local_58 = local_58 + 1) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](adj_list,(long)src);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,uStack_48);
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](sequence_of_nodes,local_58);
      if (iVar1 == *pvVar5) {
        bVar2 = true;
        break;
      }
    }
    if (!bVar2) {
      pvVar3 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](adj_list,(long)src);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,uStack_48);
      std::vector<int,_std::allocator<int>_>::push_back(real_second_edge_ids,pvVar5);
      this = std::
             vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             ::operator[](adj_more_info,(long)src);
      __x = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                      (this,uStack_48);
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                (__return_storage_ptr__,__x);
    }
    uStack_48 = uStack_48 + 1;
  } while( true );
}

Assistant:

std::vector<std::array<int, 8>> find_forward_edge_candidates(std::vector<std::vector<int>> &adj_list,
		std::vector<std::vector<std::array<int, 8>>> &adj_more_info,
		int src, std::vector<int> &sequence_of_nodes, std::vector<int> &real_second_edge_ids)
	{
		std::vector<std::array<int, 8>> edge_candidates;

		for (size_t v = 0; v < adj_list[src].size(); v++)
		{
			bool is_in_sequence_of_nodes = false;
			for (size_t i = 0; i < sequence_of_nodes.size(); i++)
			{
				if (adj_list[src][v] == sequence_of_nodes[i]) {
					is_in_sequence_of_nodes = true;
					break;
				}
			}
			if (!is_in_sequence_of_nodes) {
			  	real_second_edge_ids.push_back(adj_list[src][v]);
				edge_candidates.push_back(adj_more_info[src][v]);
			}
		}
		return edge_candidates;
	}